

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_> * __thiscall
minja::Parser::parseIfExpression
          (pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>
           *__return_storage_ptr__,Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  runtime_error *prVar5;
  shared_ptr<minja::Expression> else_expr;
  shared_ptr<minja::Expression> condition;
  string local_38;
  
  parseLogicalOr((Parser *)&condition);
  if (condition.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Expected condition expression");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((parseIfExpression()::else_tok_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parseIfExpression()::else_tok_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parseIfExpression()::else_tok_abi_cxx11_,"else\\b",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseIfExpression()::else_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseIfExpression()::else_tok_abi_cxx11_);
  }
  else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  consumeToken(&local_38,this,&parseIfExpression()::else_tok_abi_cxx11_,Strip);
  std::__cxx11::string::~string((string *)&local_38);
  if ((char *)local_38._M_string_length != (char *)0x0) {
    parseExpression((Parser *)&local_38,SUB81(this,0));
    std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
    if (else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Expected \'else\' expression");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  _Var3._M_pi = condition.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar2 = condition.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1._M_pi = else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  condition.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  condition.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->first).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (__return_storage_ptr__->first).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  (__return_storage_ptr__->second).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->second).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&else_expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&condition.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<Expression>, std::shared_ptr<Expression>> parseIfExpression() {
        auto condition = parseLogicalOr();
        if (!condition) throw std::runtime_error("Expected condition expression");

        static std::regex else_tok(R"(else\b)");
        std::shared_ptr<Expression> else_expr;
        if (!consumeToken(else_tok).empty()) {
          else_expr = parseExpression();
          if (!else_expr) throw std::runtime_error("Expected 'else' expression");
        }
        return std::pair(std::move(condition), std::move(else_expr));
    }